

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_apply_interpolation.h
# Opt level: O3

void ncnn::gridsample_3d_bilinear_apply_interpolation_p1
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  int *piVar9;
  float fVar10;
  int iVar11;
  long lVar12;
  void *pvVar13;
  long lVar14;
  long lVar15;
  int *offset_ptr;
  int *piVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  iVar3 = dst->c;
  if (0 < (long)iVar3) {
    iVar11 = dst->h * dst->w * dst->d;
    pvVar4 = src->data;
    sVar5 = src->cstep;
    sVar6 = src->elemsize;
    pvVar13 = dst->data;
    sVar7 = dst->cstep;
    sVar8 = dst->elemsize;
    piVar9 = (int *)offset_value->data;
    lVar14 = 0;
    do {
      if (0 < iVar11) {
        lVar12 = sVar5 * sVar6 * lVar14;
        lVar15 = 0;
        piVar16 = piVar9;
        do {
          fVar17 = 0.0;
          fVar18 = 0.0;
          if (-1 < (long)*piVar16) {
            fVar18 = *(float *)((long)pvVar4 + (long)*piVar16 * 4 + lVar12);
          }
          if (-1 < (long)piVar16[1]) {
            fVar17 = *(float *)((long)pvVar4 + (long)piVar16[1] * 4 + lVar12);
          }
          fVar19 = 0.0;
          fVar20 = 0.0;
          if (-1 < (long)piVar16[2]) {
            fVar20 = *(float *)((long)pvVar4 + (long)piVar16[2] * 4 + lVar12);
          }
          if (-1 < (long)piVar16[3]) {
            fVar19 = *(float *)((long)pvVar4 + (long)piVar16[3] * 4 + lVar12);
          }
          fVar21 = 0.0;
          fVar22 = 0.0;
          if (-1 < (long)piVar16[4]) {
            fVar22 = *(float *)((long)pvVar4 + (long)piVar16[4] * 4 + lVar12);
          }
          if (-1 < (long)piVar16[5]) {
            fVar21 = *(float *)((long)pvVar4 + (long)piVar16[5] * 4 + lVar12);
          }
          fVar23 = 0.0;
          fVar24 = 0.0;
          if (-1 < (long)piVar16[6]) {
            fVar24 = *(float *)((long)pvVar4 + (long)piVar16[6] * 4 + lVar12);
          }
          if (-1 < (long)piVar16[7]) {
            fVar23 = *(float *)((long)pvVar4 + (long)piVar16[7] * 4 + lVar12);
          }
          fVar1 = (float)piVar16[8];
          fVar2 = (float)piVar16[9];
          fVar10 = 1.0 - fVar1;
          fVar18 = (fVar10 * fVar18 + fVar1 * fVar17) * (1.0 - fVar2) +
                   fVar2 * (fVar10 * fVar20 + fVar1 * fVar19);
          *(float *)((long)pvVar13 + lVar15 * 4) =
               (((fVar10 * fVar22 + fVar1 * fVar21) * (1.0 - fVar2) +
                fVar2 * (fVar10 * fVar24 + fVar1 * fVar23)) - fVar18) * (float)piVar16[10] + fVar18;
          piVar16 = piVar16 + 0xb;
          lVar15 = lVar15 + 1;
        } while (iVar11 != (int)lVar15);
      }
      lVar14 = lVar14 + 1;
      pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar8);
    } while (lVar14 != iVar3);
  }
  return;
}

Assistant:

static void gridsample_3d_bilinear_apply_interpolation_p1(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int outd = dst.d;
    const int grid_size = outw * outh * outd;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int x = 0; x < grid_size; x++)
        {
            const int* offset_ptr = (int*)offset_value_ptr;
            const float* value_ptr = offset_value_ptr + 8;

            float v000 = offset_ptr[0] >= 0 ? *(srcptr + offset_ptr[0]) : 0;
            float v001 = offset_ptr[1] >= 0 ? *(srcptr + offset_ptr[1]) : 0;
            float v010 = offset_ptr[2] >= 0 ? *(srcptr + offset_ptr[2]) : 0;
            float v011 = offset_ptr[3] >= 0 ? *(srcptr + offset_ptr[3]) : 0;

            float v100 = offset_ptr[4] >= 0 ? *(srcptr + offset_ptr[4]) : 0;
            float v101 = offset_ptr[5] >= 0 ? *(srcptr + offset_ptr[5]) : 0;
            float v110 = offset_ptr[6] >= 0 ? *(srcptr + offset_ptr[6]) : 0;
            float v111 = offset_ptr[7] >= 0 ? *(srcptr + offset_ptr[7]) : 0;

            float v00 = v000 * (1 - value_ptr[0]) + v001 * value_ptr[0];
            float v01 = v010 * (1 - value_ptr[0]) + v011 * value_ptr[0];
            float v10 = v100 * (1 - value_ptr[0]) + v101 * value_ptr[0];
            float v11 = v110 * (1 - value_ptr[0]) + v111 * value_ptr[0];

            float v0 = v00 * (1 - value_ptr[1]) + v01 * value_ptr[1];
            float v1 = v10 * (1 - value_ptr[1]) + v11 * value_ptr[1];

            *dstptr = v0 * (1 - value_ptr[2]) + v1 * value_ptr[2];

            dstptr++;
            offset_value_ptr += 11;
        }
    }
}